

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase389::run(TestCase389 *this)

{
  bool errors;
  bool errors_01;
  char (*in_RDX) [45];
  char (*text) [9];
  char (*text_00) [28];
  char (*text_01) [15];
  char (*text_02) [15];
  char (*text_03) [7];
  char (*text_04) [6];
  char (*text_05) [13];
  char (*text_06) [17];
  char (*text_07) [5];
  char (*text_08) [10];
  bool errors_00;
  char (*text_09) [8];
  char (*text_10) [11];
  char (*text_11) [8];
  char (*text_12) [16];
  char *pcVar1;
  undefined1 in_R8B;
  ArrayPtr<const_unsigned_char> bytes_00;
  ArrayPtr<const_char> expected;
  ArrayPtr<const_char> expected_00;
  DebugComparison<kj::String,_const_char_(&)[55]> _kjCondition;
  Array<char> local_1f8;
  Array<char> local_1e0;
  EncodingResult<kj::String> local_1c8;
  EncodingResult<kj::String> local_1a8;
  EncodingResult<kj::String> local_188;
  EncodingResult<kj::String> local_168;
  EncodingResult<kj::String> local_148;
  EncodingResult<kj::String> local_120;
  EncodingResult<kj::String> local_100;
  EncodingResult<kj::String> local_e0;
  EncodingResult<kj::String> local_c0;
  EncodingResult<kj::String> local_a0;
  EncodingResult<kj::String> local_80;
  EncodingResult<kj::String> local_60;
  EncodingResult<kj::String> local_40;
  byte bytes [12];
  
  encodeCEscape<45ul>((String *)&local_1f8,(kj *)anon_var_dwarf_330794,in_RDX);
  local_1e0.ptr = local_1f8.ptr;
  local_1e0.size_ = local_1f8.size_;
  local_1e0.disposer = local_1f8.disposer;
  local_1f8.ptr = (char *)0x0;
  local_1f8.size_ = 0;
  kj::_::DebugExpression<kj::String>::operator==
            (&_kjCondition,(DebugExpression<kj::String> *)&local_1e0,&anon_var_dwarf_3307af);
  Array<char>::~Array(&local_1e0);
  Array<char>::~Array(&local_1f8);
  if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
    in_R8B = 0xac;
    kj::_::Debug::log<char_const(&)[243],kj::_::DebugComparison<kj::String,char_const(&)[55]>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/encoding-test.c++"
               ,0x187,ERROR,anon_var_dwarf_3307bc,&anon_var_dwarf_3307d8,&_kjCondition);
  }
  Array<char>::~Array((Array<char> *)&_kjCondition);
  encodeCEscape<9ul>((String *)&local_1f8,(kj *)"foo\x01\x7fxxx",text);
  local_1e0.ptr = local_1f8.ptr;
  local_1e0.size_ = local_1f8.size_;
  local_1e0.disposer = local_1f8.disposer;
  local_1f8.ptr = (char *)0x0;
  local_1f8.size_ = 0;
  kj::_::DebugExpression<kj::String>::operator==
            ((DebugComparison<kj::String,_const_char_(&)[15]> *)&_kjCondition,
             (DebugExpression<kj::String> *)&local_1e0,(char (*) [15])"foo\\001\\177xxx");
  Array<char>::~Array(&local_1e0);
  Array<char>::~Array(&local_1f8);
  if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
    in_R8B = 0x1b;
    kj::_::Debug::log<char_const(&)[71],kj::_::DebugComparison<kj::String,char_const(&)[15]>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/encoding-test.c++"
               ,0x189,ERROR,
               "\"failed: expected \" \"encodeCEscape(\\\"foo\\\\x01\\\\x7fxxx\\\") == \\\"foo\\\\\\\\001\\\\\\\\177xxx\\\"\", _kjCondition"
               ,(char (*) [71])
                "failed: expected encodeCEscape(\"foo\\x01\\x7fxxx\") == \"foo\\\\001\\\\177xxx\"",
               (DebugComparison<kj::String,_const_char_(&)[15]> *)&_kjCondition);
  }
  Array<char>::~Array((Array<char> *)&_kjCondition);
  builtin_memcpy(bytes,"foo",4);
  bytes[4] = '\x01';
  bytes[5] = '\x7f';
  bytes[6] = 'x';
  bytes[7] = 'x';
  bytes[8] = 'x';
  bytes[9] = 0x80;
  bytes[10] = 0xfe;
  bytes[0xb] = 0xff;
  bytes_00.size_ = 0xc;
  bytes_00.ptr = bytes;
  encodeCEscape((String *)&local_1f8,bytes_00);
  local_1e0.ptr = local_1f8.ptr;
  local_1e0.size_ = local_1f8.size_;
  local_1e0.disposer = local_1f8.disposer;
  local_1f8.ptr = (char *)0x0;
  local_1f8.size_ = 0;
  kj::_::DebugExpression<kj::String>::operator==
            ((DebugComparison<kj::String,_const_char_(&)[31]> *)&_kjCondition,
             (DebugExpression<kj::String> *)&local_1e0,
             (char (*) [31])"foo\\000\\001\\177xxx\\200\\376\\377");
  Array<char>::~Array(&local_1e0);
  Array<char>::~Array(&local_1f8);
  if ((_kjCondition.result == false) && (kj::_::Debug::minSeverity < 3)) {
    in_R8B = 0xf2;
    kj::_::Debug::log<char_const(&)[80],kj::_::DebugComparison<kj::String,char_const(&)[31]>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/encoding-test.c++"
               ,0x18b,ERROR,
               "\"failed: expected \" \"encodeCEscape(bytes) == \\\"foo\\\\\\\\000\\\\\\\\001\\\\\\\\177xxx\\\\\\\\200\\\\\\\\376\\\\\\\\377\\\"\", _kjCondition"
               ,(char (*) [80])
                "failed: expected encodeCEscape(bytes) == \"foo\\\\000\\\\001\\\\177xxx\\\\200\\\\376\\\\377\""
               ,(DebugComparison<kj::String,_const_char_(&)[31]> *)&_kjCondition);
  }
  Array<char>::~Array((Array<char> *)&_kjCondition);
  decodeCEscape<28ul>(&local_148,(kj *)"fooo\\a\\b\\f\\n\\r\\t\\v\\\'\\\"\\\\bar",text_00);
  _kjCondition.left.content.ptr = local_148.super_String.content.ptr;
  _kjCondition.left.content.size_ = local_148.super_String.content.size_;
  _kjCondition.left.content.disposer = local_148.super_String.content.disposer;
  local_148.super_String.content.ptr = (char *)0x0;
  local_148.super_String.content.size_ = 0;
  _kjCondition.right._0_1_ = local_148.hadErrors;
  (anonymous_namespace)::expectResImpl<kj::String,char>
            ((_anonymous_namespace_ *)&_kjCondition,
             (EncodingResult<kj::String> *)"fooo\a\b\f\n\r\t\v\'\"\\bar",
             (ArrayPtr<const_char>)ZEXT816(0x11),(bool)in_R8B);
  Array<char>::~Array((Array<char> *)&_kjCondition);
  Array<char>::~Array((Array<char> *)&local_148);
  decodeCEscape<15ul>(&local_40,(kj *)"foo\\x01\\x7fxxx",text_01);
  (anonymous_namespace)::expectRes<kj::String,char,9ul>
            (&local_40,(char (*) [9])"foo\x01\x7fxxx",false);
  Array<char>::~Array((Array<char> *)&local_40);
  decodeCEscape<15ul>(&local_60,(kj *)"foo\\001\\177234",text_02);
  (anonymous_namespace)::expectRes<kj::String,char,9ul>
            (&local_60,(char (*) [9])"foo\x01\x7f234",false);
  Array<char>::~Array((Array<char> *)&local_60);
  decodeCEscape<7ul>(&local_80,(kj *)"foo\\x1",text_03);
  (anonymous_namespace)::expectRes<kj::String,char,5ul>(&local_80,(char (*) [5])"foo\x01",false);
  Array<char>::~Array((Array<char> *)&local_80);
  decodeCEscape<6ul>(&local_a0,(kj *)"foo\\1",text_04);
  (anonymous_namespace)::expectRes<kj::String,char,5ul>(&local_a0,(char (*) [5])"foo\x01",false);
  Array<char>::~Array((Array<char> *)&local_a0);
  decodeCEscape<13ul>(&local_168,(kj *)"foo\\u1234bar",text_05);
  _kjCondition.left.content.ptr = local_168.super_String.content.ptr;
  _kjCondition.left.content.size_ = local_168.super_String.content.size_;
  _kjCondition.left.content.disposer = local_168.super_String.content.disposer;
  local_168.super_String.content.ptr = (char *)0x0;
  local_168.super_String.content.size_ = 0;
  _kjCondition.right._0_1_ = local_168.hadErrors;
  (anonymous_namespace)::expectResImpl<kj::String,char>
            ((_anonymous_namespace_ *)&_kjCondition,
             (EncodingResult<kj::String> *)anon_var_dwarf_3308ee,(ArrayPtr<const_char>)ZEXT816(9),
             (bool)in_R8B);
  Array<char>::~Array((Array<char> *)&_kjCondition);
  Array<char>::~Array((Array<char> *)&local_168);
  decodeCEscape<17ul>(&local_188,(kj *)"foo\\U00045678bar",text_06);
  _kjCondition.left.content.ptr = local_188.super_String.content.ptr;
  _kjCondition.left.content.size_ = local_188.super_String.content.size_;
  _kjCondition.left.content.disposer = local_188.super_String.content.disposer;
  local_188.super_String.content.ptr = (char *)0x0;
  local_188.super_String.content.size_ = 0;
  _kjCondition.right._0_1_ = local_188.hadErrors;
  (anonymous_namespace)::expectResImpl<kj::String,char>
            ((_anonymous_namespace_ *)&_kjCondition,
             (EncodingResult<kj::String> *)anon_var_dwarf_330916,(ArrayPtr<const_char>)ZEXT816(10),
             (bool)in_R8B);
  Array<char>::~Array((Array<char> *)&_kjCondition);
  Array<char>::~Array((Array<char> *)&local_188);
  pcVar1 = "foo\\";
  decodeCEscape<5ul>(&local_c0,(kj *)"foo\\",text_07);
  (anonymous_namespace)::expectRes<kj::String,char,4ul>(&local_c0,(char (*) [4])pcVar1,errors);
  Array<char>::~Array((Array<char> *)&local_c0);
  decodeCEscape<10ul>(&local_1a8,(kj *)"foo\\x123x",text_08);
  _kjCondition.left.content.ptr = local_1a8.super_String.content.ptr;
  _kjCondition.left.content.size_ = local_1a8.super_String.content.size_;
  _kjCondition.left.content.disposer = local_1a8.super_String.content.disposer;
  local_1a8.super_String.content.ptr = (char *)0x0;
  local_1a8.super_String.content.size_ = 0;
  _kjCondition.right._0_1_ = local_1a8.hadErrors;
  expected.size_ = 1;
  expected.ptr = &DAT_00000005;
  (anonymous_namespace)::expectResImpl<kj::String,char>
            ((_anonymous_namespace_ *)&_kjCondition,(EncodingResult<kj::String> *)"foo#x",expected,
             (bool)in_R8B);
  Array<char>::~Array((Array<char> *)&_kjCondition);
  Array<char>::~Array((Array<char> *)&local_1a8);
  pcVar1 = "foo\\u12";
  decodeCEscape<8ul>(&local_e0,(kj *)"foo\\u12",text_09);
  (anonymous_namespace)::expectRes<kj::String,5ul>(&local_e0,(char8_t (*) [5])pcVar1,errors_00);
  Array<char>::~Array((Array<char> *)&local_e0);
  decodeCEscape<11ul>(&local_1c8,(kj *)"foo\\u12xxx",text_10);
  _kjCondition.left.content.ptr = local_1c8.super_String.content.ptr;
  _kjCondition.left.content.size_ = local_1c8.super_String.content.size_;
  _kjCondition.left.content.disposer = local_1c8.super_String.content.disposer;
  local_1c8.super_String.content.ptr = (char *)0x0;
  local_1c8.super_String.content.size_ = 0;
  _kjCondition.right._0_1_ = local_1c8.hadErrors;
  expected_00.size_ = 1;
  expected_00.ptr = (char *)0x7;
  (anonymous_namespace)::expectResImpl<kj::String,char>
            ((_anonymous_namespace_ *)&_kjCondition,(EncodingResult<kj::String> *)"foo\x12xxx",
             expected_00,(bool)in_R8B);
  Array<char>::~Array((Array<char> *)&_kjCondition);
  Array<char>::~Array((Array<char> *)&local_1c8);
  pcVar1 = "foo\\U12";
  decodeCEscape<8ul>(&local_100,(kj *)"foo\\U12",text_11);
  (anonymous_namespace)::expectRes<kj::String,5ul>(&local_100,(char8_t (*) [5])pcVar1,errors_01);
  Array<char>::~Array((Array<char> *)&local_100);
  decodeCEscape<16ul>(&local_120,(kj *)"foo\\U12xxxxxxxx",text_12);
  (anonymous_namespace)::expectRes<kj::String,13ul>
            (&local_120,(char8_t (*) [13])"foo\x12xxxxxxxx",true);
  Array<char>::~Array((Array<char> *)&local_120);
  return;
}

Assistant:

TEST(Async, SeparateFulfillerChained) {
  EventLoop loop;
  WaitScope waitScope(loop);

  auto pair = newPromiseAndFulfiller<Promise<int>>();
  auto inner = newPromiseAndFulfiller<int>();

  EXPECT_TRUE(pair.fulfiller->isWaiting());
  pair.fulfiller->fulfill(kj::mv(inner.promise));
  EXPECT_FALSE(pair.fulfiller->isWaiting());

  inner.fulfiller->fulfill(123);

  EXPECT_EQ(123, pair.promise.wait(waitScope));
}